

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float GetColumnWidthEx(ImGuiOldColumns *columns,int column_index,bool before_resize)

{
  ImGuiOldColumnData *pIVar1;
  float fVar2;
  float local_1c;
  float offset_norm;
  bool before_resize_local;
  int column_index_local;
  ImGuiOldColumns *columns_local;
  
  offset_norm = (float)column_index;
  if (column_index < 0) {
    offset_norm = (float)columns->Current;
  }
  if (before_resize) {
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&columns->Columns,(int)offset_norm + 1);
    local_1c = pIVar1->OffsetNormBeforeResize;
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&columns->Columns,(int)offset_norm);
    local_1c = local_1c - pIVar1->OffsetNormBeforeResize;
  }
  else {
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&columns->Columns,(int)offset_norm + 1);
    local_1c = pIVar1->OffsetNorm;
    pIVar1 = ImVector<ImGuiOldColumnData>::operator[](&columns->Columns,(int)offset_norm);
    local_1c = local_1c - pIVar1->OffsetNorm;
  }
  fVar2 = ImGui::GetColumnOffsetFromNorm(columns,local_1c);
  return fVar2;
}

Assistant:

static float GetColumnWidthEx(ImGuiOldColumns* columns, int column_index, bool before_resize = false)
{
    if (column_index < 0)
        column_index = columns->Current;

    float offset_norm;
    if (before_resize)
        offset_norm = columns->Columns[column_index + 1].OffsetNormBeforeResize - columns->Columns[column_index].OffsetNormBeforeResize;
    else
        offset_norm = columns->Columns[column_index + 1].OffsetNorm - columns->Columns[column_index].OffsetNorm;
    return ImGui::GetColumnOffsetFromNorm(columns, offset_norm);
}